

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ValueRangeExpression * __thiscall
slang::BumpAllocator::
emplace<slang::ast::ValueRangeExpression,slang::ast::Type_const&,slang::ast::ValueRangeKind&,slang::ast::Expression&,slang::ast::Expression&,slang::SourceRange>
          (BumpAllocator *this,Type *args,ValueRangeKind *args_1,Expression *args_2,
          Expression *args_3,SourceRange *args_4)

{
  SourceRange sourceRange;
  ValueRangeExpression *pVVar1;
  ValueRangeExpression *in_RCX;
  SourceLocation in_RSI;
  SourceLocation in_RDI;
  Type *in_R8;
  undefined8 *in_R9;
  size_t in_stack_ffffffffffffffb8;
  size_t in_stack_ffffffffffffffc0;
  BumpAllocator *in_stack_ffffffffffffffc8;
  
  pVVar1 = (ValueRangeExpression *)
           allocate(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  sourceRange.endLoc = in_RDI;
  sourceRange.startLoc = in_RSI;
  ast::ValueRangeExpression::ValueRangeExpression
            (in_RCX,in_R8,(ValueRangeKind)((ulong)in_R9 >> 0x20),(Expression *)in_R9[1],
             (Expression *)*in_R9,sourceRange);
  return pVVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }